

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampPerAxisCase3D::renderTo
          (TextureBorderClampPerAxisCase3D *this,Surface *surface,ReferenceParams *samplerParams)

{
  code *pcVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  int extraout_var;
  RenderTarget *renderTarget;
  Texture3D *this_00;
  float *pfVar4;
  deInt32 *pdVar5;
  deUint32 *pdVar6;
  TextureRenderer *this_01;
  reference texCoord;
  PixelBufferAccess local_60;
  undefined1 local_38 [8];
  RandomViewport viewport;
  Functions *gl;
  ReferenceParams *samplerParams_local;
  Surface *surface_local;
  TextureBorderClampPerAxisCase3D *this_local;
  
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  viewport.width = (*pRVar3->_vptr_RenderContext[3])();
  viewport.height = extraout_var;
  renderTarget = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  dVar2 = getCaseSeed(this);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)local_38,renderTarget,0x80,0x80,dVar2);
  (**(code **)(viewport._8_8_ + 8))(0x84c0);
  pcVar1 = *(code **)(viewport._8_8_ + 0xb8);
  this_00 = de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::operator->
                      (&(this->m_texture).
                        super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>);
  dVar2 = glu::Texture3D::getGLTexture(this_00);
  (*pcVar1)(0x806f,dVar2);
  pcVar1 = *(code **)(viewport._8_8_ + 0x1360);
  dVar2 = glu::getGLWrapMode((samplerParams->sampler).wrapS);
  (*pcVar1)(0x806f,0x2802,dVar2);
  pcVar1 = *(code **)(viewport._8_8_ + 0x1360);
  dVar2 = glu::getGLWrapMode((samplerParams->sampler).wrapT);
  (*pcVar1)(0x806f,0x2803,dVar2);
  pcVar1 = *(code **)(viewport._8_8_ + 0x1360);
  dVar2 = glu::getGLWrapMode((samplerParams->sampler).wrapR);
  (*pcVar1)(0x806f,0x8072,dVar2);
  pcVar1 = *(code **)(viewport._8_8_ + 0x1360);
  dVar2 = glu::getGLFilterMode((samplerParams->sampler).minFilter);
  (*pcVar1)(0x806f,0x2801,dVar2);
  pcVar1 = *(code **)(viewport._8_8_ + 0x1360);
  dVar2 = glu::getGLFilterMode((samplerParams->sampler).magFilter);
  (*pcVar1)(0x806f,0x2800,dVar2);
  switch(this->m_channelClass) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    pcVar1 = *(code **)(viewport._8_8_ + 0x1358);
    pfVar4 = rr::GenericVec4::getAccess<float>(&this->m_borderColor);
    (*pcVar1)(0x806f,0x1004,pfVar4);
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    pcVar1 = *(code **)(viewport._8_8_ + 0x1340);
    pdVar5 = rr::GenericVec4::getAccess<int>(&this->m_borderColor);
    (*pcVar1)(0x806f,0x1004,pdVar5);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    pcVar1 = *(code **)(viewport._8_8_ + 0x1348);
    pdVar6 = rr::GenericVec4::getAccess<unsigned_int>(&this->m_borderColor);
    (*pcVar1)(0x806f,0x1004,pdVar6);
  }
  dVar2 = (**(code **)(viewport._8_8_ + 0x800))();
  glu::checkError(dVar2,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureBorderClampTests.cpp"
                  ,0x897);
  (**(code **)(viewport._8_8_ + 0x1a00))(local_38._0_4_,local_38._4_4_,viewport.x,viewport.y);
  this_01 = de::details::
            UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
            ::operator->(&(this->m_renderer).
                          super_UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
                        );
  texCoord = std::vector<float,_std::allocator<float>_>::operator[](&this->m_texCoords,0);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (this_01,0,texCoord,&samplerParams->super_RenderParams);
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_60,surface);
  glu::readPixels(pRVar3,local_38._0_4_,local_38._4_4_,&local_60);
  return;
}

Assistant:

void TextureBorderClampPerAxisCase3D::renderTo (tcu::Surface&									surface,
												const glu::TextureTestUtil::ReferenceParams&	samplerParams)
{
	const glw::Functions&						gl			= m_context.getRenderContext().getFunctions();
	const gls::TextureTestUtil::RandomViewport	viewport	(m_context.getRenderTarget(), VIEWPORT_WIDTH, VIEWPORT_HEIGHT, getCaseSeed());

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_3D, m_texture->getGLTexture());

	// Setup filtering and wrap modes.
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_S,		glu::getGLWrapMode(samplerParams.sampler.wrapS));
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_T,		glu::getGLWrapMode(samplerParams.sampler.wrapT));
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_R,		glu::getGLWrapMode(samplerParams.sampler.wrapR));
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER,	glu::getGLFilterMode(samplerParams.sampler.minFilter));
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER,	glu::getGLFilterMode(samplerParams.sampler.magFilter));

	switch (m_channelClass)
	{
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
			gl.texParameterfv(GL_TEXTURE_3D, GL_TEXTURE_BORDER_COLOR, m_borderColor.getAccess<float>());
			break;

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			gl.texParameterIiv(GL_TEXTURE_3D, GL_TEXTURE_BORDER_COLOR, m_borderColor.getAccess<deInt32>());
			break;

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			gl.texParameterIuiv(GL_TEXTURE_3D, GL_TEXTURE_BORDER_COLOR, m_borderColor.getAccess<deUint32>());
			break;

		default:
			DE_ASSERT(false);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);
	m_renderer->renderQuad(0, &m_texCoords[0], samplerParams);
	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, surface.getAccess());
}